

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool operator==(Matrix *lhs,Matrix *rhs)

{
  bool bVar1;
  int iVar2;
  Fraction *a;
  Fraction *b;
  bool bVar3;
  int i;
  int iVar4;
  
  iVar4 = lhs->n_;
  if ((iVar4 == rhs->n_) && (iVar2 = lhs->m_, iVar2 == rhs->m_)) {
    bVar3 = true;
    if (0 < iVar4) {
      i = 0;
      do {
        if (0 < iVar2) {
          iVar4 = 0;
          do {
            a = Matrix::At(lhs,i,iVar4);
            b = Matrix::At(rhs,i,iVar4);
            bVar1 = operator!=(a,b);
            if (bVar1) goto LAB_0010a4a6;
            iVar4 = iVar4 + 1;
            iVar2 = lhs->m_;
          } while (iVar4 < iVar2);
          iVar4 = lhs->n_;
        }
        i = i + 1;
      } while (i < iVar4);
    }
  }
  else {
LAB_0010a4a6:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

int Matrix::GetNumRows() const {
  return n_;
}